

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

ostream * doctest::operator<<(ostream *s,String *in)

{
  size_t sVar1;
  
  if ((in->field_0).buf[0x17] < '\0') {
    in = (String *)(in->field_0).data.ptr;
  }
  if (in == (String *)0x0) {
    std::ios::clear((int)s + (int)*(undefined8 *)(*(long *)s + -0x18));
  }
  else {
    sVar1 = strlen((char *)in);
    std::__ostream_insert<char,std::char_traits<char>>(s,(char *)in,sVar1);
  }
  return s;
}

Assistant:

std::ostream& operator<<(std::ostream& s, const String& in) { return s << in.c_str(); }